

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopDescriptor::PostModificationCleanup(LoopDescriptor *this)

{
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> this_00;
  bool bVar1;
  Loop *pLVar2;
  reference ppLVar3;
  iterator __first;
  iterator __last;
  reference ppVar4;
  pointer pLVar5;
  BasicBlockListTy *this_01;
  reference pvVar6;
  pointer local_e8;
  uint32_t local_dc;
  _Node_iterator_base<unsigned_int,_false> _Stack_d8;
  uint32_t block_id;
  const_iterator __end4;
  const_iterator __begin4;
  BasicBlockListTy *__range4;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> loop_2;
  Loop *parent;
  pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>
  *pair;
  iterator __end2_2;
  iterator __begin2_2;
  LoopsToAddContainerType *__range2_2;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  local_78;
  const_iterator local_70;
  Loop *local_68;
  Loop *loop_1;
  iterator __end2_1;
  iterator __begin2_1;
  LoopContainerType *__range2_1;
  Loop *loop;
  iterator __end2;
  iterator __begin2;
  LoopContainerType *__range2;
  LoopContainerType loops_to_remove_;
  LoopDescriptor *this_local;
  
  loops_to_remove_.super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2);
  __end2 = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                     (&this->loops_);
  loop = (Loop *)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                           (&this->loops_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                                     *)&loop), bVar1) {
    ppLVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              ::operator*(&__end2);
    __range2_1 = (LoopContainerType *)*ppLVar3;
    bVar1 = Loop::IsMarkedForRemoval((Loop *)__range2_1);
    if (bVar1) {
      std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2,
                 (value_type *)&__range2_1);
      bVar1 = Loop::HasParent((Loop *)__range2_1);
      if (bVar1) {
        pLVar2 = Loop::GetParent((Loop *)__range2_1);
        Loop::RemoveChildLoop(pLVar2,(Loop *)__range2_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                       ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                        &__range2);
  loop_1 = (Loop *)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                             ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                               *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                             *)&loop_1), bVar1) {
    ppLVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              ::operator*(&__end2_1);
    local_68 = *ppLVar3;
    __first = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                        (&this->loops_);
    __last = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                       (&this->loops_);
    local_78 = std::
               find<__gnu_cxx::__normal_iterator<spvtools::opt::Loop**,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>,spvtools::opt::Loop*>
                         (__first._M_current,__last._M_current,&local_68);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
    ::__normal_iterator<spvtools::opt::Loop**>
              ((__normal_iterator<spvtools::opt::Loop*const*,std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>>
                *)&local_70,&local_78);
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::erase
              (&this->loops_,local_70);
    pLVar2 = local_68;
    if (local_68 != (Loop *)0x0) {
      Loop::~Loop(local_68);
      operator_delete(pLVar2,0x90);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::
             vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
             ::begin(&this->loops_to_add_);
  pair = (pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>
          *)std::
            vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
            ::end(&this->loops_to_add_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_*,_std::vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>_>
                             *)&pair), bVar1) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_*,_std::vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>_>
             ::operator*(&__end2_2);
    loop_2._M_t.
    super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
    super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>,_true,_true>
         )ppVar4->first;
    std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::unique_ptr
              ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)
               &__range4,&ppVar4->second);
    if ((__uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>)
        loop_2._M_t.
        super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
        super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>)0x0) {
      pLVar5 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
               operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                           *)&__range4);
      Loop::SetParent(pLVar5,(Loop *)0x0);
      this_00 = loop_2;
      pLVar5 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::get
                         ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                           *)&__range4);
      Loop::AddNestedLoop((Loop *)this_00._M_t.
                                  super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                  .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                          pLVar5);
      pLVar5 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
               operator->((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                           *)&__range4);
      this_01 = Loop::GetBlocks(pLVar5);
      __end4 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin(this_01);
      _Stack_d8._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end(this_01);
      while (bVar1 = std::__detail::operator!=
                               (&__end4.super__Node_iterator_base<unsigned_int,_false>,
                                &stack0xffffffffffffff28), bVar1) {
        pvVar6 = std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*(&__end4);
        local_dc = *pvVar6;
        Loop::AddBasicBlock((Loop *)loop_2._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                    .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>.
                                    _M_head_impl,local_dc);
        std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end4);
      }
    }
    local_e8 = std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::
               release((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *
                       )&__range4);
    std::vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>>::
    emplace_back<spvtools::opt::Loop*>
              ((vector<spvtools::opt::Loop*,std::allocator<spvtools::opt::Loop*>> *)this,&local_e8);
    std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>::~unique_ptr
              ((unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> *)
               &__range4);
    __gnu_cxx::
    __normal_iterator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_*,_std::vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>_>
    ::operator++(&__end2_2);
  }
  std::
  vector<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>,_std::allocator<std::pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>_>_>
  ::clear(&this->loops_to_add_);
  std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~vector
            ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2);
  return;
}

Assistant:

void LoopDescriptor::PostModificationCleanup() {
  LoopContainerType loops_to_remove_;
  for (Loop* loop : loops_) {
    if (loop->IsMarkedForRemoval()) {
      loops_to_remove_.push_back(loop);
      if (loop->HasParent()) {
        loop->GetParent()->RemoveChildLoop(loop);
      }
    }
  }

  for (Loop* loop : loops_to_remove_) {
    loops_.erase(std::find(loops_.begin(), loops_.end(), loop));
    delete loop;
  }

  for (auto& pair : loops_to_add_) {
    Loop* parent = pair.first;
    std::unique_ptr<Loop> loop = std::move(pair.second);

    if (parent) {
      loop->SetParent(nullptr);
      parent->AddNestedLoop(loop.get());

      for (uint32_t block_id : loop->GetBlocks()) {
        parent->AddBasicBlock(block_id);
      }
    }

    loops_.emplace_back(loop.release());
  }

  loops_to_add_.clear();
}